

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending_query_result.cpp
# Opt level: O1

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::PendingQueryResult::ExecuteInternal(PendingQueryResult *this,ClientContextLock *lock)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  PendingExecutionResult PVar1;
  pointer pAVar2;
  pointer this_01;
  ClientContext *pCVar3;
  PendingQueryResult *in_RDX;
  ClientContextLock *lock_00;
  _func_int **local_30;
  
  lock_00 = lock;
  CheckExecutableInternal((PendingQueryResult *)lock,lock);
  do {
    PVar1 = ExecuteTaskInternal((PendingQueryResult *)lock,lock_00);
    switch(PVar1) {
    case RESULT_READY:
    case EXECUTION_ERROR:
    case EXECUTION_FINISHED:
      if (*(char *)&lock[0x19].client_guard._M_device == '\0') {
        if (*(char *)&lock[0x2c].client_guard._M_device == '\x01') {
          make_uniq<duckdb::StreamQueryResult,duckdb::ErrorData&>
                    ((duckdb *)&local_30,(ErrorData *)(lock + 0x1a));
        }
        else {
          make_uniq<duckdb::MaterializedQueryResult,duckdb::ErrorData&>
                    ((duckdb *)&local_30,(ErrorData *)(lock + 0x1a));
        }
        (this->super_BaseQueryResult)._vptr_BaseQueryResult = local_30;
      }
      else {
        pCVar3 = shared_ptr<duckdb::ClientContext,_true>::operator->
                           ((shared_ptr<duckdb::ClientContext,_true> *)(lock + 0x2a));
        ClientContext::FetchResultInternal((ClientContext *)this,(ClientContextLock *)pCVar3,in_RDX)
        ;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lock[0x2b].client_guard._M_device;
        lock[0x2a].client_guard._M_device = (mutex_type *)0x0;
        lock[0x2b].client_guard._M_device = (mutex_type *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
             (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
    case BLOCKED:
      CheckExecutableInternal((PendingQueryResult *)lock,lock_00);
      pCVar3 = shared_ptr<duckdb::ClientContext,_true>::operator->
                         ((shared_ptr<duckdb::ClientContext,_true> *)(lock + 0x2a));
      pAVar2 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
               ::operator->(&pCVar3->active_query);
      this_01 = unique_ptr<duckdb::Executor,_std::default_delete<duckdb::Executor>,_true>::
                operator->(&pAVar2->executor);
      Executor::WaitForTask(this_01);
    }
  } while( true );
}

Assistant:

unique_ptr<QueryResult> PendingQueryResult::ExecuteInternal(ClientContextLock &lock) {
	CheckExecutableInternal(lock);

	PendingExecutionResult execution_result;
	while (!IsResultReady(execution_result = ExecuteTaskInternal(lock))) {
		if (execution_result == PendingExecutionResult::BLOCKED) {
			CheckExecutableInternal(lock);
			context->WaitForTask(lock, *this);
		}
	}
	if (HasError()) {
		if (allow_stream_result) {
			return make_uniq<StreamQueryResult>(error);
		} else {
			return make_uniq<MaterializedQueryResult>(error);
		}
	}
	auto result = context->FetchResultInternal(lock, *this);
	Close();
	return result;
}